

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.h
# Opt level: O2

BuiltinFunction Func::GetBuiltInIndex(Opnd *opnd)

{
  code *pcVar1;
  bool bVar2;
  BuiltinFunction BVar3;
  byte bVar4;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  SymOpnd *pSVar7;
  PropertySym *pPVar8;
  
  if (opnd == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.h"
                       ,0x36c,"(opnd)","opnd");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar2 = IR::Opnd::IsRegOpnd(opnd);
  if (bVar2) {
    pRVar6 = IR::Opnd::AsRegOpnd(opnd);
    bVar4 = (pRVar6->m_sym->m_builtInIndex)._value;
  }
  else {
    bVar2 = IR::Opnd::IsSymOpnd(opnd);
    bVar4 = 'H';
    if (bVar2) {
      pSVar7 = IR::Opnd::AsSymOpnd(opnd);
      pPVar8 = Sym::AsPropertySym(pSVar7->m_sym);
      BVar3 = Js::JavascriptLibrary::GetBuiltinFunctionForPropId(pPVar8->m_propertyId);
      return (BuiltinFunction)BVar3._value;
    }
  }
  return (BuiltinFunction)bVar4;
}

Assistant:

static Js::BuiltinFunction GetBuiltInIndex(IR::Opnd* opnd)
    {
        Assert(opnd);
        Js::BuiltinFunction index;
        if (opnd->IsRegOpnd())
        {
            index = opnd->AsRegOpnd()->m_sym->m_builtInIndex;
        }
        else if (opnd->IsSymOpnd())
        {
            PropertySym *propertySym = opnd->AsSymOpnd()->m_sym->AsPropertySym();
            index = Js::JavascriptLibrary::GetBuiltinFunctionForPropId(propertySym->m_propertyId);
        }
        else
        {
            index = Js::BuiltinFunction::None;
        }
        return index;
    }